

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sin.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  ostream *poVar3;
  int in_EDI;
  double dVar4;
  ostringstream error_message_7;
  double output;
  int i;
  double omega;
  ostringstream error_message_6;
  ostringstream error_message_5;
  ostringstream error_message_4;
  int tmp;
  int max;
  int min;
  ostringstream error_message_3;
  ostringstream error_message_2;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  OutputFormats output_format;
  double amplitude;
  double period;
  int output_length;
  option *in_stack_fffffffffffff098;
  double *in_stack_fffffffffffff0a0;
  allocator *paVar5;
  string *in_stack_fffffffffffff0a8;
  ostringstream *poVar6;
  undefined8 in_stack_fffffffffffff0b0;
  ostream *in_stack_fffffffffffff0d0;
  byte local_ee2;
  bool local_e92;
  bool local_e6a;
  bool local_e42;
  allocator local_e21;
  string local_e20 [32];
  ostringstream local_e00 [136];
  ostringstream *in_stack_fffffffffffff288;
  string *in_stack_fffffffffffff290;
  int local_c7c;
  allocator local_c69;
  string local_c68 [32];
  ostringstream local_c48 [383];
  allocator local_ac9;
  string local_ac8 [32];
  ostringstream local_aa8 [383];
  allocator local_929;
  string local_928 [32];
  ostringstream local_908 [383];
  allocator local_789;
  string local_788 [32];
  int local_768;
  undefined4 local_764;
  undefined4 local_760;
  allocator local_759;
  string local_758 [32];
  ostringstream local_738 [383];
  allocator local_5b9;
  string local_5b8 [39];
  allocator local_591;
  string local_590 [32];
  ostringstream local_570 [383];
  allocator local_3f1;
  string local_3f0 [39];
  allocator local_3c9;
  string local_3c8 [32];
  ostringstream local_3a8 [383];
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [32];
  ostringstream local_1e0 [399];
  allocator local_51;
  string local_50 [32];
  int local_30;
  int local_2c;
  undefined8 local_28;
  double local_20;
  int local_14;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = -1;
  local_20 = 10.0;
  local_28 = 0x3ff0000000000000;
  local_2c = 0;
  local_8 = in_EDI;
  while (local_30 = ya_getopt_long((int)((ulong)in_stack_fffffffffffff0b0 >> 0x20),
                                   (char **)in_stack_fffffffffffff0a8,
                                   (char *)in_stack_fffffffffffff0a0,in_stack_fffffffffffff098,
                                   (int *)0x1036bc), pcVar1 = ya_optarg, local_30 != -1) {
    switch(local_30) {
    case 0x61:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5b8,pcVar1,&local_5b9);
      bVar2 = sptk::ConvertStringToDouble(in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0);
      std::__cxx11::string::~string(local_5b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_738);
        std::operator<<((ostream *)local_738,"The argument for the -a option must be numeric");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_758,"sin",&local_759);
        sptk::PrintErrorMessage(in_stack_fffffffffffff290,in_stack_fffffffffffff288);
        std::__cxx11::string::~string(local_758);
        std::allocator<char>::~allocator((allocator<char> *)&local_759);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_738);
        return local_4;
      }
      break;
    default:
      anon_unknown.dwarf_ca7::PrintUsage(in_stack_fffffffffffff0d0);
      return 1;
    case 0x68:
      anon_unknown.dwarf_ca7::PrintUsage(in_stack_fffffffffffff0d0);
      return 0;
    case 0x6c:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_50,pcVar1,&local_51);
      bVar2 = sptk::ConvertStringToInteger
                        (in_stack_fffffffffffff0a8,(int *)in_stack_fffffffffffff0a0);
      local_e42 = !bVar2 || local_14 < 1;
      std::__cxx11::string::~string(local_50);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
      if (local_e42) {
        std::__cxx11::ostringstream::ostringstream(local_1e0);
        std::operator<<((ostream *)local_1e0,
                        "The argument for the -l option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_200,"sin",&local_201);
        sptk::PrintErrorMessage(in_stack_fffffffffffff290,in_stack_fffffffffffff288);
        std::__cxx11::string::~string(local_200);
        std::allocator<char>::~allocator((allocator<char> *)&local_201);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1e0);
        return local_4;
      }
      break;
    case 0x6d:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_228,pcVar1,&local_229);
      bVar2 = sptk::ConvertStringToInteger
                        (in_stack_fffffffffffff0a8,(int *)in_stack_fffffffffffff0a0);
      local_e6a = !bVar2 || local_14 < 0;
      std::__cxx11::string::~string(local_228);
      std::allocator<char>::~allocator((allocator<char> *)&local_229);
      if (local_e6a) {
        std::__cxx11::ostringstream::ostringstream(local_3a8);
        std::operator<<((ostream *)local_3a8,
                        "The argument for the -m option must be a non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3c8,"sin",&local_3c9);
        sptk::PrintErrorMessage(in_stack_fffffffffffff290,in_stack_fffffffffffff288);
        std::__cxx11::string::~string(local_3c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_3a8);
        return local_4;
      }
      local_14 = local_14 + 1;
      break;
    case 0x6f:
      local_760 = 0;
      local_764 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_788,pcVar1,&local_789);
      bVar2 = sptk::ConvertStringToInteger
                        (in_stack_fffffffffffff0a8,(int *)in_stack_fffffffffffff0a0);
      local_ee2 = 1;
      if (bVar2) {
        bVar2 = sptk::IsInRange(local_768,0,1);
        local_ee2 = bVar2 ^ 0xff;
      }
      std::__cxx11::string::~string(local_788);
      std::allocator<char>::~allocator((allocator<char> *)&local_789);
      if ((local_ee2 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_908);
        poVar3 = std::operator<<((ostream *)local_908,
                                 "The argument for the -o option must be an integer ");
        poVar3 = std::operator<<(poVar3,"in the range of ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
        poVar3 = std::operator<<(poVar3," to ");
        std::ostream::operator<<(poVar3,1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_928,"sin",&local_929);
        sptk::PrintErrorMessage(in_stack_fffffffffffff290,in_stack_fffffffffffff288);
        std::__cxx11::string::~string(local_928);
        std::allocator<char>::~allocator((allocator<char> *)&local_929);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_908);
        return local_4;
      }
      local_2c = local_768;
      break;
    case 0x70:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3f0,pcVar1,&local_3f1);
      bVar2 = sptk::ConvertStringToDouble(in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0);
      local_e92 = !bVar2 || local_20 <= 0.0;
      std::__cxx11::string::~string(local_3f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
      if (local_e92) {
        std::__cxx11::ostringstream::ostringstream(local_570);
        std::operator<<((ostream *)local_570,
                        "The argument for the -p option must be a positive number");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_590,"sin",&local_591);
        sptk::PrintErrorMessage(in_stack_fffffffffffff290,in_stack_fffffffffffff288);
        std::__cxx11::string::~string(local_590);
        std::allocator<char>::~allocator((allocator<char> *)&local_591);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_570);
        return local_4;
      }
    }
  }
  if (local_8 != ya_optind) {
    std::__cxx11::ostringstream::ostringstream(local_aa8);
    std::operator<<((ostream *)local_aa8,"Input file is not required");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_ac8,"sin",&local_ac9);
    sptk::PrintErrorMessage(in_stack_fffffffffffff290,in_stack_fffffffffffff288);
    std::__cxx11::string::~string(local_ac8);
    std::allocator<char>::~allocator((allocator<char> *)&local_ac9);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_aa8);
    return local_4;
  }
  bVar2 = sptk::SetBinaryMode();
  if (!bVar2) {
    poVar6 = local_c48;
    std::__cxx11::ostringstream::ostringstream(poVar6);
    std::operator<<((ostream *)poVar6,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c68,"sin",&local_c69);
    sptk::PrintErrorMessage(in_stack_fffffffffffff290,in_stack_fffffffffffff288);
    std::__cxx11::string::~string(local_c68);
    std::allocator<char>::~allocator((allocator<char> *)&local_c69);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_c48);
    return local_4;
  }
  dVar4 = 6.283185307179586 / local_20;
  local_c7c = 0;
  while( true ) {
    if (local_14 != -1 && local_14 <= local_c7c) {
      return 0;
    }
    if (local_2c == 0) {
      sin(dVar4 * (double)local_c7c);
    }
    else {
      if (local_2c != 1) {
        return 1;
      }
      cos(dVar4 * (double)local_c7c);
    }
    bVar2 = sptk::WriteStream<double>((double)in_stack_fffffffffffff098,(ostream *)0x1045f7);
    if (!bVar2) break;
    local_c7c = local_c7c + 1;
  }
  poVar6 = local_e00;
  std::__cxx11::ostringstream::ostringstream(poVar6);
  std::operator<<((ostream *)poVar6,"Failed to write sinusoidal sequence");
  paVar5 = &local_e21;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e20,"sin",paVar5);
  sptk::PrintErrorMessage(in_stack_fffffffffffff290,in_stack_fffffffffffff288);
  std::__cxx11::string::~string(local_e20);
  std::allocator<char>::~allocator((allocator<char> *)&local_e21);
  local_4 = 1;
  std::__cxx11::ostringstream::~ostringstream(local_e00);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int output_length(kMagicNumberForInfinity);
  double period(kDefaultPeriod);
  double amplitude(kDefaultAmplitude);
  OutputFormats output_format(kDefaultOutputFormat);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:p:a:o:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &output_length) ||
            output_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("sin", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &output_length) ||
            output_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                           "non-negative integer";
          sptk::PrintErrorMessage("sin", error_message);
          return 1;
        }
        ++output_length;
        break;
      }
      case 'p': {
        if (!sptk::ConvertStringToDouble(optarg, &period) || period <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -p option must be a positive number";
          sptk::PrintErrorMessage("sin", error_message);
          return 1;
        }
        break;
      }
      case 'a': {
        if (!sptk::ConvertStringToDouble(optarg, &amplitude)) {
          std::ostringstream error_message;
          error_message << "The argument for the -a option must be numeric";
          sptk::PrintErrorMessage("sin", error_message);
          return 1;
        }
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("sin", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (0 != argc - optind) {
    std::ostringstream error_message;
    error_message << "Input file is not required";
    sptk::PrintErrorMessage("sin", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("sin", error_message);
    return 1;
  }

  const double omega(sptk::kTwoPi / period);
  for (int i(0); kMagicNumberForInfinity == output_length || i < output_length;
       ++i) {
    double output;
    switch (output_format) {
      case kSine: {
        output = amplitude * std::sin(omega * i);
        break;
      }
      case kCosine: {
        output = amplitude * std::cos(omega * i);
        break;
      }
      default: {
        return 1;
      }
    }
    if (!sptk::WriteStream(output, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write sinusoidal sequence";
      sptk::PrintErrorMessage("sin", error_message);
      return 1;
    }
  }

  return 0;
}